

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O0

void __thiscall
hta::Metric::Metric(Metric *this,
                   unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>
                   *storage_metric)

{
  bool bVar1;
  pointer pMVar2;
  rep extraout_RDX;
  undefined1 local_70 [16];
  int64_t local_60;
  undefined1 local_58 [8];
  rep local_50;
  Duration local_30 [3];
  unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_> *local_18;
  unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_> *storage_metric_local
  ;
  Metric *this_local;
  
  local_18 = storage_metric;
  storage_metric_local = &this->storage_metric_;
  std::unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>::unique_ptr
            (&this->storage_metric_,storage_metric);
  pMVar2 = std::unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>::
           operator->(&this->storage_metric_);
  (**pMVar2->_vptr_Metric)(local_30);
  (this->interval_min_).__r = local_30[0].__r;
  pMVar2 = std::unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>::
           operator->(&this->storage_metric_);
  (**pMVar2->_vptr_Metric)(local_58);
  (this->interval_max_).__r = local_50;
  pMVar2 = std::unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>::
           operator->(&this->storage_metric_);
  (**pMVar2->_vptr_Metric)(local_70);
  IntervalFactor::IntervalFactor(&this->interval_factor_,local_60);
  pMVar2 = std::unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>::
           operator->(&this->storage_metric_);
  (*pMVar2->_vptr_Metric[0xc])();
  (this->previous_time_).
  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r =
       extraout_RDX;
  std::
  map<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level,_std::less<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level>_>_>
  ::map(&this->levels_);
  bVar1 = std::chrono::operator>(&this->interval_min_,&this->interval_max_);
  if (!bVar1) {
    return;
  }
  throw_exception<hta::Exception,char_const*>("interval_min > interval_max");
}

Assistant:

Metric::Metric(std::unique_ptr<storage::Metric> storage_metric)
: storage_metric_(std::move(storage_metric)), interval_min_(storage_metric_->meta().interval_min),
  interval_max_(storage_metric_->meta().interval_max),
  interval_factor_(storage_metric_->meta().interval_factor),
  previous_time_(storage_metric_->range().second)
{
    if (interval_min_ > interval_max_)
    {
        throw_exception("interval_min > interval_max");
    }
}